

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O0

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<int>::Visit
          (PrecomputeVisitor<int> *this,shared_ptr<const_calc4::ConditionalOperator> *op)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<const_calc4::Operator> *in_RDI;
  int conditionValue;
  shared_ptr<const_calc4::Operator> ifFalse;
  shared_ptr<const_calc4::Operator> ifTrue;
  shared_ptr<const_calc4::Operator> condition;
  shared_ptr<const_calc4::ConditionalOperator> *in_stack_ffffffffffffff78;
  shared_ptr<const_calc4::Operator> *in_stack_ffffffffffffff80;
  shared_ptr<const_calc4::Operator> *this_00;
  PrecomputeVisitor<int> *in_stack_ffffffffffffff98;
  shared_ptr<const_calc4::Operator> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  shared_ptr<const_calc4::Operator> local_50 [2];
  shared_ptr<const_calc4::Operator> local_30 [3];
  
  peVar2 = std::
           __shared_ptr_access<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13f9eb);
  ConditionalOperator::GetCondition(peVar2);
  Precompute(in_stack_ffffffffffffff98,in_RDI);
  peVar2 = std::
           __shared_ptr_access<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13fa0f);
  ConditionalOperator::GetIfTrue(peVar2);
  Precompute(in_stack_ffffffffffffff98,in_RDI);
  peVar2 = std::
           __shared_ptr_access<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13fa35);
  ConditionalOperator::GetIfFalse(peVar2);
  Precompute(in_stack_ffffffffffffff98,in_RDI);
  bVar1 = TryGetPrecomputedValue
                    ((PrecomputeVisitor<int> *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
  if (bVar1) {
    if (in_stack_ffffffffffffffac == 0) {
      this_00 = local_50;
    }
    else {
      this_00 = local_30;
    }
    std::shared_ptr<const_calc4::Operator>::operator=
              (this_00,(shared_ptr<const_calc4::Operator> *)in_stack_ffffffffffffff78);
  }
  else {
    ConditionalOperator::Create
              ((shared_ptr<const_calc4::Operator> *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa0,
               (shared_ptr<const_calc4::Operator> *)in_stack_ffffffffffffff98);
    std::shared_ptr<calc4::Operator_const>::operator=
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::shared_ptr<const_calc4::ConditionalOperator>::~shared_ptr
              ((shared_ptr<const_calc4::ConditionalOperator> *)0x13fb1e);
  }
  std::shared_ptr<const_calc4::Operator>::~shared_ptr((shared_ptr<const_calc4::Operator> *)0x13fb28)
  ;
  std::shared_ptr<const_calc4::Operator>::~shared_ptr((shared_ptr<const_calc4::Operator> *)0x13fb32)
  ;
  std::shared_ptr<const_calc4::Operator>::~shared_ptr((shared_ptr<const_calc4::Operator> *)0x13fb3c)
  ;
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const ConditionalOperator>& op) override
    {
        std::shared_ptr<const Operator> condition = Precompute(op->GetCondition());
        std::shared_ptr<const Operator> ifTrue = Precompute(op->GetIfTrue());
        std::shared_ptr<const Operator> ifFalse = Precompute(op->GetIfFalse());

        TNumber conditionValue;
        if (TryGetPrecomputedValue(condition, &conditionValue))
        {
            value = conditionValue != 0 ? ifTrue : ifFalse;
        }
        else
        {
            value = ConditionalOperator::Create(condition, ifTrue, ifFalse);
        }
    }